

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O3

string * __thiscall
yactfr::internal::ReadFlUIntInstr::_toStr_abi_cxx11_
          (string *__return_storage_ptr__,ReadFlUIntInstr *this,Size param_1)

{
  ostream *poVar1;
  ostringstream ss;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  ReadFlBitArrayInstr::_commonToStr_abi_cxx11_(&local_1a8,(ReadFlBitArrayInstr *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFlUIntInstr::_toStr(Size) const
{
    std::ostringstream ss;

    ss << this->_commonToStr() << std::endl;
    return ss.str();
}